

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O3

void __thiscall
SimpleStringInternalCache::clearAllIncludingCurrentlyUsedMemory(SimpleStringInternalCache *this)

{
  undefined8 *puVar1;
  SimpleStringInternalCacheNode *pSVar2;
  long lVar3;
  
  pSVar2 = this->cache_;
  lVar3 = 0;
  do {
    destroySimpleStringMemoryBlockList
              (this,*(SimpleStringMemoryBlock **)((long)&pSVar2->freeMemoryHead_ + lVar3),
               *(size_t *)((long)&pSVar2->size_ + lVar3));
    destroySimpleStringMemoryBlockList
              (this,*(SimpleStringMemoryBlock **)((long)&this->cache_->usedMemoryHead_ + lVar3),
               *(size_t *)((long)&this->cache_->size_ + lVar3));
    pSVar2 = this->cache_;
    puVar1 = (undefined8 *)((long)&pSVar2->freeMemoryHead_ + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x78);
  destroySimpleStringMemoryBlockList(this,this->nonCachedAllocations_,0);
  this->nonCachedAllocations_ = (SimpleStringMemoryBlock *)0x0;
  return;
}

Assistant:

void SimpleStringInternalCache::clearAllIncludingCurrentlyUsedMemory()
{
    for (size_t i = 0; i < amountOfInternalCacheNodes; i++) {
        destroySimpleStringMemoryBlockList(cache_[i].freeMemoryHead_, cache_[i].size_);
        destroySimpleStringMemoryBlockList(cache_[i].usedMemoryHead_, cache_[i].size_);
        cache_[i].freeMemoryHead_ = NULLPTR;
        cache_[i].usedMemoryHead_ = NULLPTR;
    }

    destroySimpleStringMemoryBlockList(nonCachedAllocations_, 0);
    nonCachedAllocations_ = NULLPTR;
}